

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Hero::getSprite(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *__return_storage_ptr__,Hero *this)

{
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  vector<int,_std::allocator<int>_> *local_a0;
  allocator<std::vector<int,_std::allocator<int>_>_> local_6e;
  undefined1 local_6d;
  allocator<int> local_5d;
  int local_5c;
  iterator local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> local_28;
  Hero *this_local;
  
  local_6d = 1;
  local_5c = 2;
  local_58 = &local_5c;
  local_50 = 1;
  local_48 = &local_40;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  this_local = (Hero *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_5d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_5d);
  local_6d = 0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_40;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_6e);
  __l_00._M_len =
       (size_type)
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_00._M_array =
       (iterator)
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,__l_00,&local_6e);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_6e);
  local_a0 = &local_28;
  do {
    local_a0 = local_a0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_a0);
  } while (local_a0 != &local_40);
  std::allocator<int>::~allocator(&local_5d);
  return __return_storage_ptr__;
}

Assistant:

vvi getSprite() const { return {{character}}; }